

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gl4cGPUShaderFP64Tests.cpp
# Opt level: O0

string * __thiscall
gl4cts::GPUShaderFP64Test6::getTessellationEvaluationShaderBody_abi_cxx11_
          (string *__return_storage_ptr__,GPUShaderFP64Test6 *this,_test_case *test_case)

{
  ostream *poVar1;
  _variable_type type;
  _variable_type type_00;
  _variable_type type_01;
  string local_218;
  string local_1f8;
  string local_1d8;
  stringstream local_1a8 [8];
  stringstream result_sstream;
  ostream local_198;
  _test_case *local_20;
  _test_case *test_case_local;
  GPUShaderFP64Test6 *this_local;
  
  local_20 = test_case;
  test_case_local = (_test_case *)this;
  this_local = (GPUShaderFP64Test6 *)__return_storage_ptr__;
  std::__cxx11::stringstream::stringstream(local_1a8);
  std::operator<<(&local_198,"#version 420\n\nlayout(isolines) in;\n\nvoid main()\n{\n");
  Utils::getVariableTypeString_abi_cxx11_(&local_1d8,(Utils *)(ulong)local_20->src_type,type);
  poVar1 = std::operator<<(&local_198,(string *)&local_1d8);
  std::operator<<(poVar1," src");
  std::__cxx11::string::~string((string *)&local_1d8);
  if (1 < local_20->src_array_size) {
    poVar1 = std::operator<<(&local_198,"[");
    poVar1 = (ostream *)std::ostream::operator<<(poVar1,local_20->src_array_size);
    std::operator<<(poVar1,"]");
  }
  std::operator<<(&local_198,";\n");
  if ((local_20->wrap_dst_type_in_structure & 1U) == 0) {
    Utils::getVariableTypeString_abi_cxx11_(&local_218,(Utils *)(ulong)local_20->dst_type,type_00);
    poVar1 = std::operator<<(&local_198,(string *)&local_218);
    std::operator<<(poVar1," dst");
    std::__cxx11::string::~string((string *)&local_218);
  }
  else {
    poVar1 = std::operator<<(&local_198,"struct\n{\n");
    Utils::getVariableTypeString_abi_cxx11_(&local_1f8,(Utils *)(ulong)local_20->dst_type,type_01);
    poVar1 = std::operator<<(poVar1,(string *)&local_1f8);
    std::operator<<(poVar1," member");
    std::__cxx11::string::~string((string *)&local_1f8);
  }
  if ((local_20->wrap_dst_type_in_structure & 1U) == 0) {
    std::operator<<(&local_198,";\n");
  }
  else {
    std::operator<<(&local_198,";\n} dst;\n");
  }
  std::operator<<(&local_198,"dst = src;\n");
  std::operator<<(&local_198,"}\n");
  std::__cxx11::stringstream::str();
  std::__cxx11::stringstream::~stringstream(local_1a8);
  return __return_storage_ptr__;
}

Assistant:

std::string GPUShaderFP64Test6::getTessellationEvaluationShaderBody(const _test_case& test_case)
{
	std::stringstream result_sstream;

	/* Add preamble */
	result_sstream << "#version 420\n"
					  "\n"
					  "layout(isolines) in;\n"
					  "\n"
					  "void main()\n"
					  "{\n";

	/* Add local variable declarations */
	result_sstream << Utils::getVariableTypeString(test_case.src_type) << " src";

	if (test_case.src_array_size > 1)
	{
		result_sstream << "[" << test_case.src_array_size << "]";
	}

	result_sstream << ";\n";

	if (test_case.wrap_dst_type_in_structure)
	{
		result_sstream << "struct\n"
						  "{\n"
					   << Utils::getVariableTypeString(test_case.dst_type) << " member";
	}
	else
	{
		result_sstream << Utils::getVariableTypeString(test_case.dst_type) << " dst";
	}

	if (test_case.wrap_dst_type_in_structure)
	{
		result_sstream << ";\n"
						  "} dst;\n";
	}
	else
	{
		result_sstream << ";\n";
	}

	/* Continue with the actual body. */
	result_sstream << "dst = src;\n";

	/* Complete the body */
	result_sstream << "}\n";

	/* Return the body */
	return result_sstream.str();
}